

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O1

int decompose(int n,int *ifac,int *ntryh)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int nl;
  long lVar6;
  int iVar7;
  long lVar8;
  bool bVar9;
  
  iVar7 = *ntryh;
  if (iVar7 == 0) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar5 = 0;
    iVar1 = n;
LAB_00105e76:
    do {
      if (iVar1 == 1) {
        iVar3 = 1;
      }
      else {
        iVar2 = iVar1 / iVar7;
        iVar3 = iVar1;
        uVar4 = uVar5;
        if (iVar1 == iVar2 * iVar7) {
          uVar4 = uVar5 + 1;
          ifac[(long)(int)uVar5 + 2] = iVar7;
          iVar3 = iVar2;
          if (uVar5 != 0 && iVar7 == 2) {
            if (0 < (int)uVar5) {
              lVar8 = 0;
              do {
                ifac[(ulong)uVar4 + lVar8 + 1] = ifac[(ulong)uVar4 + lVar8];
                lVar8 = lVar8 + -1;
              } while (2 - (ulong)(uVar5 + 2) != lVar8);
            }
            ifac[2] = 2;
          }
        }
        uVar5 = uVar4;
        bVar9 = iVar1 == iVar2 * iVar7;
        iVar1 = iVar3;
        if (bVar9) goto LAB_00105e76;
      }
      iVar7 = ntryh[lVar6 + 1];
      lVar6 = lVar6 + 1;
      iVar1 = iVar3;
    } while (iVar7 != 0);
  }
  *ifac = n;
  ifac[1] = uVar5;
  return uVar5;
}

Assistant:

static int decompose(int n, int *ifac, const int *ntryh) {
  int nl = n, nf = 0, i, j = 0;
  for (j=0; ntryh[j]; ++j) {
    int ntry = ntryh[j];
    while (nl != 1) {
      int nq = nl / ntry;
      int nr = nl - ntry * nq;
      if (nr == 0) {
        ifac[2+nf++] = ntry;
        nl = nq;
        if (ntry == 2 && nf != 1) {
          for (i = 2; i <= nf; ++i) {
            int ib = nf - i + 2;
            ifac[ib + 1] = ifac[ib];
          }
          ifac[2] = 2;
        }
      } else break;
    }
  }
  ifac[0] = n;
  ifac[1] = nf;  
  return nf;
}